

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::string_to_int(char **pBuf,int *value)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint c;
  uint result2;
  uint result8;
  bool negative;
  char *pcStack_28;
  uint result;
  char *p;
  int *value_local;
  char **pBuf_local;
  
  *value = 0;
  pcStack_28 = *pBuf;
  while( true ) {
    bVar2 = false;
    if (*pcStack_28 != '\0') {
      iVar1 = isspace((int)*pcStack_28);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    pcStack_28 = pcStack_28 + 1;
  }
  result8 = 0;
  bVar2 = false;
  iVar1 = isdigit((int)*pcStack_28);
  if (iVar1 == 0) {
    if (*pcStack_28 != '-') {
      return false;
    }
    bVar2 = true;
    pcStack_28 = pcStack_28 + 1;
  }
  while( true ) {
    bVar3 = false;
    if (*pcStack_28 != '\0') {
      iVar1 = isdigit((int)*pcStack_28);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) {
      if (bVar2) {
        if (0x80000000 < result8) {
          *value = 0;
          return false;
        }
        *value = -result8;
      }
      else {
        if (0x7fffffff < result8) {
          *value = 0;
          return false;
        }
        *value = result8;
      }
      *pBuf = pcStack_28;
      return true;
    }
    if ((result8 & 0xe0000000) != 0) {
      return false;
    }
    if (result8 * -8 - 1 < result8 * 2) break;
    if (result8 * -10 - 1 < (int)*pcStack_28 - 0x30U) {
      return false;
    }
    result8 = ((int)*pcStack_28 - 0x30U) + result8 * 10;
    pcStack_28 = pcStack_28 + 1;
  }
  return false;
}

Assistant:

bool string_to_int(const char*& pBuf, int& value)
    {
        value = 0;

        CRNLIB_ASSERT(pBuf);
        const char* p = pBuf;

        while (*p && isspace(*p))
        {
            p++;
        }

        uint result = 0;
        bool negative = false;

        if (!isdigit(*p))
        {
            if (p[0] == '-')
            {
                negative = true;
                p++;
            }
            else
            {
                return false;
            }
        }

        while (*p && isdigit(*p))
        {
            if (result & 0xE0000000U)
            {
                return false;
            }

            const uint result8 = result << 3U;
            const uint result2 = result << 1U;

            if (result2 > (0xFFFFFFFFU - result8))
            {
                return false;
            }

            result = result8 + result2;

            uint c = p[0] - '0';
            if (c > (0xFFFFFFFFU - result))
            {
                return false;
            }

            result += c;

            p++;
        }

        if (negative)
        {
            if (result > 0x80000000U)
            {
                value = 0;
                return false;
            }
            value = -static_cast<int>(result);
        }
        else
        {
            if (result > 0x7FFFFFFFU)
            {
                value = 0;
                return false;
            }
            value = static_cast<int>(result);
        }

        pBuf = p;

        return true;
    }